

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_set_dirty_m68k(CPUState *cpu,target_ulong_conflict vaddr)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  pvVar1 = cpu->env_ptr;
  uVar2 = vaddr & 0xfffff000;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 0x10) {
    lVar3 = *(long *)((long)pvVar1 + lVar4 + -0x28);
    uVar6 = (ulong)((*(uint *)((long)pvVar1 + lVar4 + -0x30) >> 6 & vaddr >> 0xc) << 6);
    if (*(int *)(lVar3 + 4 + uVar6) == uVar2 + 0x400) {
      *(uint *)(lVar3 + uVar6 + 4) = uVar2;
    }
  }
  lVar4 = (long)pvVar1 + -0x564;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 0x40) {
      if (*(int *)(lVar4 + lVar5) == uVar2 + 0x400) {
        *(uint *)(lVar4 + lVar5) = uVar2;
      }
    }
    lVar4 = lVar4 + 0x2b0;
  }
  return;
}

Assistant:

void tlb_set_dirty(CPUState *cpu, target_ulong vaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    // assert_cpu_is_self(cpu);

    vaddr &= TARGET_PAGE_MASK;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        tlb_set_dirty1_locked(tlb_entry(env, mmu_idx, vaddr), vaddr);
    }

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        int k;
        for (k = 0; k < CPU_VTLB_SIZE; k++) {
            tlb_set_dirty1_locked(&env_tlb(env)->d[mmu_idx].vtable[k], vaddr);
        }
    }
}